

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::SkelAnimation>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               SkelAnimation *skelanim,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *this;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
  *this_00;
  TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
  *this_01;
  _Base_ptr *pp_Var1;
  double dVar2;
  pointer pSVar3;
  allocator aVar4;
  ostringstream oVar5;
  __type _Var6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  value_type *pvVar10;
  long lVar11;
  value_type *value;
  value_type *pvVar13;
  _Base_ptr p_Var14;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar15;
  value_type *value_00;
  size_type sVar16;
  mapped_type *this_02;
  _Base_ptr p_Var17;
  Property *pPVar18;
  _Base_ptr p_Var19;
  Property *args_1;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
  *in_stack_fffffffffffffbc8;
  ParseResult ret_2;
  undefined1 local_3f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3e0;
  _Base_ptr local_3d0;
  optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> local_3c8;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string local_308;
  string attr_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_228;
  TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  local_218 [11];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  Property *pPVar12;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var17 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = &skelanim->rotations;
  this_01 = &skelanim->scales;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar22 = (_Rb_tree_header *)p_Var17 == &(properties->_M_t)._M_impl.super__Rb_tree_header;
    if (bVar22) {
      bVar22 = true;
LAB_001a762a:
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&table);
      return bVar22;
    }
    local_3d0 = p_Var17 + 1;
    ::std::__cxx11::string::string(local_50,(string *)local_3d0);
    this = (Property *)(p_Var17 + 2);
    ::std::__cxx11::string::string((string *)&ss_e,"joints",(allocator *)&ret_2);
    pPVar18 = (Property *)&ss_e;
    (anonymous_namespace)::
    ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
              (&ret,(_anonymous_namespace_ *)&table,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50,(string *)this,(Property *)&ss_e,(string *)&skelanim->joints,
               (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
               in_stack_fffffffffffffbc8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar8 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      bVar7 = false;
      iVar8 = 3;
    }
    else {
      bVar7 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar9 = ::std::operator<<(poVar9,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar9 = ::std::operator<<(poVar9,":");
        poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
        poVar9 = ::std::operator<<(poVar9,"():");
        poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xbaf);
        ::std::operator<<(poVar9," ");
        ::std::__cxx11::string::string
                  ((string *)local_3f0,"Parsing attribute `{}` failed. Error: {}",
                   (allocator *)&local_3c8);
        fmt::format<char[7],std::__cxx11::string>
                  ((string *)&ret_2,(fmt *)local_3f0,(string *)"joints",(char (*) [7])&ret.err,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar18);
        poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_2);
        ::std::operator<<(poVar9,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ret_2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_3f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)err,(string *)&ret_2);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        bVar7 = false;
        iVar8 = 1;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar7) {
      ::std::__cxx11::string::string(local_70,(string *)local_3d0);
      ::std::__cxx11::string::string((string *)&ss_e,"translations",(allocator *)&ret_2);
      pPVar18 = this;
      args_1 = (Property *)&ss_e;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                (&ret,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,(string *)this,(Property *)&ss_e,(string *)&skelanim->translations,
                 in_stack_fffffffffffffbc8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar8 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        iVar8 = 3;
LAB_001a61cf:
        bVar7 = false;
      }
      else {
        bVar7 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xbb0);
          ::std::operator<<(poVar9," ");
          ::std::__cxx11::string::string
                    ((string *)local_3f0,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&local_3c8);
          pPVar18 = (Property *)&ret.err;
          fmt::format<char[13],std::__cxx11::string>
                    ((string *)&ret_2,(fmt *)local_3f0,(string *)"translations",
                     (char (*) [13])pPVar18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_2);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_3f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret_2);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar8 = 1;
          goto LAB_001a61cf;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar7) goto LAB_001a7609;
      ::std::__cxx11::string::string((string *)&local_258,(string *)local_3d0);
      ::std::__cxx11::string::string
                ((string *)&local_308,"rotations",(allocator *)&stack0xfffffffffffffbcf);
      ret_2.err._M_dataplus._M_p = (pointer)&ret_2.err.field_2;
      ret_2.err._M_string_length = 0;
      ret_2.err.field_2._M_local_buf[0] = '\0';
      iVar8 = ::std::__cxx11::string::compare((string *)&local_258);
      if (iVar8 == 0) {
        if (((ulong)p_Var17[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          ret_2.code = PropertyTypeMismatch;
          ::std::__cxx11::string::string
                    ((string *)&ret,"Property `{}` must be Attribute, but declared as Relationship."
                     ,(allocator *)local_3f0);
          fmt::format<std::__cxx11::string>
                    ((string *)&ss_e,(fmt *)&ret,&local_308,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar18);
          ::std::__cxx11::string::operator=((string *)&ret_2.err,(string *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        if (p_Var17[6]._M_left != p_Var17[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(skelanim->rotations)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var17[6]._M_parent);
          ret_2.code = Success;
        }
        Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)this);
        tinyusdz::value::
        TypeTraits<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>::
        type_name_abi_cxx11_();
        _Var6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ss_e,&attr_type_name);
        if (_Var6) {
          ::std::__cxx11::string::_M_dispose();
LAB_001a6339:
          iVar8 = *(int *)((long)&p_Var17[0x17]._M_parent + 4);
          if (iVar8 == 1) {
            bVar7 = Attribute::is_blocked((Attribute *)this);
            if (bVar7) {
              (skelanim->rotations)._blocked = true;
            }
            pp_Var1 = &p_Var17[4]._M_parent;
            bVar7 = primvar::PrimVar::has_value((PrimVar *)pp_Var1);
            if ((bVar7) || (p_Var17[5]._M_left != p_Var17[5]._M_parent)) {
              local_218[0]._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              local_218[0]._17_8_ = 0;
              local_218[0]._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_218[0]._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
              local_218[0]._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
              aStack_228._M_allocated_capacity._0_2_ = 0;
              aStack_228._2_8_ = 0;
              _ss_e = (pointer)0x0;
              bVar7 = primvar::PrimVar::is_valid((PrimVar *)pp_Var1);
              if (bVar7) {
                bVar7 = primvar::PrimVar::has_value((PrimVar *)pp_Var1);
                if (bVar7) {
                  primvar::PrimVar::
                  get_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                            (&local_3c8,(PrimVar *)pp_Var1);
                  bVar7 = local_3c8.has_value_;
                  local_3f0[0] = (allocator)local_3c8.has_value_;
                  if ((allocator)local_3c8.has_value_ == (allocator)0x1) {
                    local_3f0._8_8_ = local_3c8.contained.data.__align;
                    aStack_3e0._M_allocated_capacity = local_3c8.contained._8_8_;
                    aStack_3e0._8_8_ = local_3c8.contained._16_8_;
                    local_3c8.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                    local_3c8.contained._8_8_ = 0;
                    local_3c8.contained._16_8_ = 0;
                    nonstd::optional_lite::
                    optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                    ::~optional(&local_3c8);
                    pvVar10 = nonstd::optional_lite::
                              optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                              ::value((optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                       *)local_3f0);
                    Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                    ::set((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                           *)&ss_e,pvVar10);
                  }
                  else {
                    nonstd::optional_lite::
                    optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                    ::~optional(&local_3c8);
                  }
                  nonstd::optional_lite::
                  optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                  ::~optional((optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                               *)local_3f0);
                  pPVar18 = (Property *)p_Var17[5]._M_parent;
                  pPVar12 = (Property *)p_Var17[5]._M_left;
                  if (pPVar12 == pPVar18) {
                    if ((allocator)bVar7 == (allocator)0x0) goto LAB_001a67eb;
                  }
                  else {
LAB_001a666f:
                    lVar20 = 0;
                    for (uVar21 = 0; lVar11 = (long)pPVar12 - (long)pPVar18,
                        pPVar18 = (Property *)0x28, uVar21 < (ulong)(lVar11 / 0x28);
                        uVar21 = uVar21 + 1) {
                      pvVar15 = tinyusdz::value::TimeSamples::get_samples
                                          ((TimeSamples *)&p_Var17[5]._M_parent);
                      pSVar3 = (pvVar15->
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      if ((&pSVar3->blocked)[lVar20] == true) {
                        TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                        ::add_blocked_sample
                                  ((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                    *)local_218,*(double *)((long)&pSVar3->t + lVar20));
                      }
                      else {
                        tinyusdz::value::Value::
                        get_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                                  (&local_3c8,(Value *)((long)&(pSVar3->value).v_.storage + lVar20),
                                   false);
                        local_3f0[0] = (allocator)local_3c8.has_value_;
                        if ((allocator)local_3c8.has_value_ == (allocator)0x1) {
                          local_3f0._8_8_ = local_3c8.contained.data.__align;
                          aStack_3e0._M_allocated_capacity = local_3c8.contained._8_8_;
                          aStack_3e0._8_8_ = local_3c8.contained._16_8_;
                          local_3c8.contained.data.__align =
                               (anon_struct_8_0_00000001_for___align)0x0;
                          local_3c8.contained._8_8_ = 0;
                          local_3c8.contained._16_8_ = 0;
                        }
                        nonstd::optional_lite::
                        optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                        ::~optional(&local_3c8);
                        aVar4 = local_3f0[0];
                        if (local_3f0[0] == (allocator)0x1) {
                          dVar2 = *(double *)((long)&pSVar3->t + lVar20);
                          pvVar10 = nonstd::optional_lite::
                                    optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                    ::value((optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                             *)local_3f0);
                          TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                          ::add_sample((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                        *)local_218,dVar2,pvVar10);
                        }
                        else {
                          ret.err.field_2._M_allocated_capacity = 0;
                          ret.err.field_2._8_8_ = 0;
                          ret.err._M_dataplus._M_p = (pointer)0x0;
                          ret.err._M_string_length = 0;
                        }
                        nonstd::optional_lite::
                        optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                        ::~optional((optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                     *)local_3f0);
                        if (aVar4 == (allocator)0x0) goto LAB_001a659e;
                      }
                      pPVar18 = (Property *)p_Var17[5]._M_parent;
                      pPVar12 = (Property *)p_Var17[5]._M_left;
                      lVar20 = lVar20 + 0x28;
                    }
                    ret.code = ret.code & 0xffffff00;
                  }
                  nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                  ::
                  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_0>
                            ((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                              *)&ret,(Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                      *)&ss_e);
                }
                else {
                  pPVar18 = (Property *)p_Var17[5]._M_parent;
                  pPVar12 = (Property *)p_Var17[5]._M_left;
                  if (pPVar12 != pPVar18) goto LAB_001a666f;
LAB_001a67eb:
                  ret.code = ret.code & 0xffffff00;
                  ret.err.field_2._M_allocated_capacity = 0;
                  ret.err.field_2._8_8_ = 0;
                  ret.err._M_dataplus._M_p = (pointer)0x0;
                  ret.err._M_string_length = 0;
                }
              }
              else {
                ret.err.field_2._M_allocated_capacity = 0;
                ret.err.field_2._8_8_ = 0;
                ret.err._M_dataplus._M_p = (pointer)0x0;
                ret.err._M_string_length = 0;
LAB_001a659e:
                ret.code = ret.code & 0xffffff00;
              }
              Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
              ::~Animatable((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                             *)&ss_e);
              nonstd::optional_lite::
              optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
              ::
              optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>,_0>
                        ((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                          *)&ss_e,(optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                   *)&ret);
              nonstd::optional_lite::
              optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
              ::~optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                           *)&ret);
              oVar5 = ss_e;
              if (ss_e == (ostringstream)0x1) {
                value = nonstd::optional_lite::
                        optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                        ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                 *)&ss_e);
                nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
                ::operator=((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
                             *)&(skelanim->rotations)._attrib,value);
              }
              else {
                ret_2.code = InternalError;
                ::std::__cxx11::string::assign((char *)&ret_2.err);
              }
              nonstd::optional_lite::
              optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
              ::~optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                           *)&ss_e);
              if (oVar5 != (ostringstream)0x0) {
                AttrMetas::operator=(&this_00->_metas,(AttrMetas *)(p_Var17 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_308);
                ret_2.code = Success;
              }
            }
            else if (p_Var17[6]._M_left != p_Var17[6]._M_parent) {
              AttrMetas::operator=(&this_00->_metas,(AttrMetas *)(p_Var17 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,&local_258);
              ret_2.code = Success;
            }
          }
          else if (iVar8 == 0) {
            (skelanim->rotations)._value_empty = true;
            AttrMetas::operator=(&this_00->_metas,(AttrMetas *)(p_Var17 + 7));
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&table,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_308);
            ret_2.code = Success;
          }
          else {
            ::std::__cxx11::string::assign((char *)&ret_2.err);
            ret_2.code = InternalError;
          }
        }
        else {
          tinyusdz::value::
          TypeTraits<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>::
          underlying_type_name_abi_cxx11_();
          _Var6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ret,&attr_type_name);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (_Var6) goto LAB_001a6339;
          ret_2.code = TypeMismatch;
          ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_e);
          poVar9 = ::std::operator<<((ostream *)aStack_228._M_local_buf,"Property type mismatch. ");
          poVar9 = ::std::operator<<(poVar9,(string *)&local_308);
          poVar9 = ::std::operator<<(poVar9," expects type `");
          tinyusdz::value::
          TypeTraits<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>::
          type_name_abi_cxx11_();
          poVar9 = ::std::operator<<(poVar9,(string *)&ret);
          poVar9 = ::std::operator<<(poVar9,"` but defined as type `");
          poVar9 = ::std::operator<<(poVar9,(string *)&attr_type_name);
          ::std::operator<<(poVar9,"`");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&ret_2.err,(string *)&ret);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_e);
        }
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        ret_2.code = Unmatched;
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar8 = 0;
      if ((ret_2.code & ~AlreadyProcessed) == Success) {
        iVar8 = 3;
LAB_001a6a01:
        bVar7 = false;
      }
      else {
        bVar7 = true;
        if (ret_2.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xbb1);
          ::std::operator<<(poVar9," ");
          ::std::__cxx11::string::string
                    ((string *)local_3f0,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&local_3c8);
          pPVar18 = (Property *)&ret_2.err;
          fmt::format<char[10],std::__cxx11::string>
                    ((string *)&ret,(fmt *)local_3f0,(string *)"rotations",(char (*) [10])pPVar18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_3f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar8 = 1;
          goto LAB_001a6a01;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar7) goto LAB_001a7609;
      ::std::__cxx11::string::string((string *)&local_278,(string *)local_3d0);
      ::std::__cxx11::string::string
                ((string *)&local_308,"scales",(allocator *)&stack0xfffffffffffffbcf);
      ret_2.err._M_dataplus._M_p = (pointer)&ret_2.err.field_2;
      ret_2.err._M_string_length = 0;
      ret_2.err.field_2._M_local_buf[0] = '\0';
      iVar8 = ::std::__cxx11::string::compare((string *)&local_278);
      if (iVar8 == 0) {
        if (((ulong)p_Var17[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          ret_2.code = PropertyTypeMismatch;
          ::std::__cxx11::string::string
                    ((string *)&ret,"Property `{}` must be Attribute, but declared as Relationship."
                     ,(allocator *)local_3f0);
          fmt::format<std::__cxx11::string>
                    ((string *)&ss_e,(fmt *)&ret,&local_308,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar18);
          ::std::__cxx11::string::operator=((string *)&ret_2.err,(string *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        if (p_Var17[6]._M_left != p_Var17[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(skelanim->scales)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var17[6]._M_parent);
          ret_2.code = Success;
        }
        Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)this);
        tinyusdz::value::
        TypeTraits<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
        ::type_name_abi_cxx11_();
        _Var6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ss_e,&attr_type_name);
        if (_Var6) {
          ::std::__cxx11::string::_M_dispose();
LAB_001a6b68:
          iVar8 = *(int *)((long)&p_Var17[0x17]._M_parent + 4);
          if (iVar8 == 1) {
            bVar7 = Attribute::is_blocked((Attribute *)this);
            if (bVar7) {
              (skelanim->scales)._blocked = true;
            }
            pp_Var1 = &p_Var17[4]._M_parent;
            bVar7 = primvar::PrimVar::has_value((PrimVar *)pp_Var1);
            if ((bVar7) || (p_Var17[5]._M_left != p_Var17[5]._M_parent)) {
              local_218[0]._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              local_218[0]._17_8_ = 0;
              local_218[0]._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_218[0]._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
              local_218[0]._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
              aStack_228._M_allocated_capacity._0_2_ = 0;
              aStack_228._2_8_ = 0;
              _ss_e = (pointer)0x0;
              bVar7 = primvar::PrimVar::is_valid((PrimVar *)pp_Var1);
              if (bVar7) {
                bVar7 = primvar::PrimVar::has_value((PrimVar *)pp_Var1);
                if (bVar7) {
                  primvar::PrimVar::
                  get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                            ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                              *)&local_3c8,(PrimVar *)pp_Var1);
                  bVar7 = local_3c8.has_value_;
                  local_3f0[0] = (allocator)local_3c8.has_value_;
                  if ((allocator)local_3c8.has_value_ == (allocator)0x1) {
                    local_3f0._8_8_ = local_3c8.contained.data.__align;
                    aStack_3e0._M_allocated_capacity = local_3c8.contained._8_8_;
                    aStack_3e0._8_8_ = local_3c8.contained._16_8_;
                    local_3c8.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                    local_3c8.contained._8_8_ = 0;
                    local_3c8.contained._16_8_ = 0;
                    nonstd::optional_lite::
                    optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                    ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                 *)&local_3c8);
                    pvVar13 = nonstd::optional_lite::
                              optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                              ::value((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                       *)local_3f0);
                    Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                    ::set((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                           *)&ss_e,pvVar13);
                  }
                  else {
                    nonstd::optional_lite::
                    optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                    ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                 *)&local_3c8);
                  }
                  nonstd::optional_lite::
                  optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                  ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                               *)local_3f0);
                  p_Var19 = p_Var17[5]._M_parent;
                  p_Var14 = p_Var17[5]._M_left;
                  if (p_Var14 == p_Var19) {
                    if ((allocator)bVar7 == (allocator)0x0) goto LAB_001a701a;
                  }
                  else {
LAB_001a6e9e:
                    lVar20 = 0;
                    for (uVar21 = 0; uVar21 < (ulong)(((long)p_Var14 - (long)p_Var19) / 0x28);
                        uVar21 = uVar21 + 1) {
                      pvVar15 = tinyusdz::value::TimeSamples::get_samples
                                          ((TimeSamples *)&p_Var17[5]._M_parent);
                      pSVar3 = (pvVar15->
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      if ((&pSVar3->blocked)[lVar20] == true) {
                        TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                        ::add_blocked_sample(local_218,*(double *)((long)&pSVar3->t + lVar20));
                      }
                      else {
                        tinyusdz::value::Value::
                        get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                                  ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                    *)&local_3c8,
                                   (Value *)((long)&(pSVar3->value).v_.storage + lVar20),false);
                        local_3f0[0] = (allocator)local_3c8.has_value_;
                        if ((allocator)local_3c8.has_value_ == (allocator)0x1) {
                          local_3f0._8_8_ = local_3c8.contained.data.__align;
                          aStack_3e0._M_allocated_capacity = local_3c8.contained._8_8_;
                          aStack_3e0._8_8_ = local_3c8.contained._16_8_;
                          local_3c8.contained.data.__align =
                               (anon_struct_8_0_00000001_for___align)0x0;
                          local_3c8.contained._8_8_ = 0;
                          local_3c8.contained._16_8_ = 0;
                        }
                        nonstd::optional_lite::
                        optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                        ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                     *)&local_3c8);
                        aVar4 = local_3f0[0];
                        if (local_3f0[0] == (allocator)0x1) {
                          dVar2 = *(double *)((long)&pSVar3->t + lVar20);
                          pvVar13 = nonstd::optional_lite::
                                    optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                    ::value((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                             *)local_3f0);
                          TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                          ::add_sample(local_218,dVar2,pvVar13);
                        }
                        else {
                          ret.err.field_2._M_allocated_capacity = 0;
                          ret.err.field_2._8_8_ = 0;
                          ret.err._M_dataplus._M_p = (pointer)0x0;
                          ret.err._M_string_length = 0;
                        }
                        nonstd::optional_lite::
                        optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                        ::~optional((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                     *)local_3f0);
                        if (aVar4 == (allocator)0x0) goto LAB_001a6dcd;
                      }
                      p_Var19 = p_Var17[5]._M_parent;
                      p_Var14 = p_Var17[5]._M_left;
                      lVar20 = lVar20 + 0x28;
                    }
                    ret.code = ret.code & 0xffffff00;
                  }
                  nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                  ::
                  optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_0>
                            ((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                              *)&ret,(Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                      *)&ss_e);
                }
                else {
                  p_Var19 = p_Var17[5]._M_parent;
                  p_Var14 = p_Var17[5]._M_left;
                  if (p_Var14 != p_Var19) goto LAB_001a6e9e;
LAB_001a701a:
                  ret.code = ret.code & 0xffffff00;
                  ret.err.field_2._M_allocated_capacity = 0;
                  ret.err.field_2._8_8_ = 0;
                  ret.err._M_dataplus._M_p = (pointer)0x0;
                  ret.err._M_string_length = 0;
                }
              }
              else {
                ret.err.field_2._M_allocated_capacity = 0;
                ret.err.field_2._8_8_ = 0;
                ret.err._M_dataplus._M_p = (pointer)0x0;
                ret.err._M_string_length = 0;
LAB_001a6dcd:
                ret.code = ret.code & 0xffffff00;
              }
              Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
              ::~Animatable((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                             *)&ss_e);
              nonstd::optional_lite::
              optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
              ::
              optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>,_0>
                        ((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                          *)&ss_e,(optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                   *)&ret);
              nonstd::optional_lite::
              optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
              ::~optional((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                           *)&ret);
              oVar5 = ss_e;
              if (ss_e == (ostringstream)0x1) {
                value_00 = nonstd::optional_lite::
                           optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                           ::value((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                    *)&ss_e);
                nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                             *)&(skelanim->scales)._attrib,value_00);
              }
              else {
                ret_2.code = InternalError;
                ::std::__cxx11::string::assign((char *)&ret_2.err);
              }
              nonstd::optional_lite::
              optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
              ::~optional((optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                           *)&ss_e);
              if (oVar5 != (ostringstream)0x0) {
                AttrMetas::operator=(&this_01->_metas,(AttrMetas *)(p_Var17 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_308);
                ret_2.code = Success;
              }
            }
            else if (p_Var17[6]._M_left != p_Var17[6]._M_parent) {
              AttrMetas::operator=(&this_01->_metas,(AttrMetas *)(p_Var17 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,&local_278);
              ret_2.code = Success;
            }
          }
          else if (iVar8 == 0) {
            (skelanim->scales)._value_empty = true;
            AttrMetas::operator=(&this_01->_metas,(AttrMetas *)(p_Var17 + 7));
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&table,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_308);
            ret_2.code = Success;
          }
          else {
            ::std::__cxx11::string::assign((char *)&ret_2.err);
            ret_2.code = InternalError;
          }
        }
        else {
          tinyusdz::value::
          TypeTraits<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
          ::underlying_type_name_abi_cxx11_();
          _Var6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ret,&attr_type_name);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (_Var6) goto LAB_001a6b68;
          ret_2.code = TypeMismatch;
          ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_e);
          poVar9 = ::std::operator<<((ostream *)aStack_228._M_local_buf,"Property type mismatch. ");
          poVar9 = ::std::operator<<(poVar9,(string *)&local_308);
          poVar9 = ::std::operator<<(poVar9," expects type `");
          tinyusdz::value::
          TypeTraits<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
          ::type_name_abi_cxx11_();
          poVar9 = ::std::operator<<(poVar9,(string *)&ret);
          poVar9 = ::std::operator<<(poVar9,"` but defined as type `");
          poVar9 = ::std::operator<<(poVar9,(string *)&attr_type_name);
          ::std::operator<<(poVar9,"`");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&ret_2.err,(string *)&ret);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_e);
        }
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        ret_2.code = Unmatched;
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar8 = 0;
      if ((ret_2.code & ~AlreadyProcessed) == Success) {
        iVar8 = 3;
LAB_001a7230:
        bVar7 = false;
      }
      else {
        bVar7 = true;
        if (ret_2.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xbb2);
          ::std::operator<<(poVar9," ");
          ::std::__cxx11::string::string
                    ((string *)local_3f0,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&local_3c8);
          fmt::format<char[7],std::__cxx11::string>
                    ((string *)&ret,(fmt *)local_3f0,(string *)"scales",(char (*) [7])&ret_2.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_3f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar8 = 1;
          goto LAB_001a7230;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar7) goto LAB_001a7609;
      ::std::__cxx11::string::string(local_90,(string *)local_3d0);
      ::std::__cxx11::string::string((string *)&ss_e,"blendShapes",(allocator *)&ret_2);
      pPVar18 = (Property *)&ss_e;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                (&ret,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90,(string *)this,(Property *)&ss_e,(string *)&skelanim->blendShapes,
                 (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                 in_stack_fffffffffffffbc8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar8 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        iVar8 = 3;
LAB_001a73e6:
        bVar7 = false;
      }
      else {
        bVar7 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xbb3);
          ::std::operator<<(poVar9," ");
          ::std::__cxx11::string::string
                    ((string *)local_3f0,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&local_3c8);
          fmt::format<char[12],std::__cxx11::string>
                    ((string *)&ret_2,(fmt *)local_3f0,(string *)0x2e7f62,(char (*) [12])&ret.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar18);
          poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_2);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_3f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret_2);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar8 = 1;
          goto LAB_001a73e6;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar7) goto LAB_001a7609;
      ::std::__cxx11::string::string(local_b0,(string *)local_3d0);
      ::std::__cxx11::string::string((string *)&ss_e,"blendShapeWeights",(allocator *)&ret_2);
      pPVar18 = (Property *)&ss_e;
      (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                (&ret,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b0,(string *)this,(Property *)&ss_e,(string *)&skelanim->blendShapeWeights
                 ,(TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                   *)in_stack_fffffffffffffbc8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar8 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        iVar8 = 3;
LAB_001a759f:
        bVar7 = false;
      }
      else {
        bVar7 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xbb4);
          ::std::operator<<(poVar9," ");
          ::std::__cxx11::string::string
                    ((string *)local_3f0,"Parsing attribute `{}` failed. Error: {}",
                     (allocator *)&local_3c8);
          fmt::format<char[18],std::__cxx11::string>
                    ((string *)&ret_2,(fmt *)local_3f0,(string *)"blendShapeWeights",
                     (char (*) [18])&ret.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar18);
          poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret_2);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret_2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_3f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&ret_2);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar8 = 1;
          goto LAB_001a759f;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      p_Var19 = local_3d0;
      if (!bVar7) goto LAB_001a7609;
      sVar16 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&table,(key_type *)local_3d0);
      if (sVar16 == 0) {
        this_02 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::operator[](&skelanim->props,(key_type *)p_Var19);
        Property::operator=(this_02,this);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var19);
      }
      sVar16 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&table,(key_type *)p_Var19);
      if (sVar16 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar9 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar9 = ::std::operator<<(poVar9,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar9 = ::std::operator<<(poVar9,":");
        poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
        poVar9 = ::std::operator<<(poVar9,"():");
        poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xbb6);
        ::std::operator<<(poVar9," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                         "Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         p_Var19);
        poVar9 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
        ::std::operator<<(poVar9,"\n");
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &ret_2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)err);
          ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        bVar22 = false;
        goto LAB_001a762a;
      }
    }
    else {
LAB_001a7609:
      if ((iVar8 != 3) && (iVar8 != 0)) goto LAB_001a762a;
    }
    p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
  } while( true );
}

Assistant:

bool ReconstructPrim<SkelAnimation>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    SkelAnimation *skelanim,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)spec;
  (void)warn;
  (void)references;
  (void)options;
  std::set<std::string> table;
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "joints", SkelAnimation, skelanim->joints)
    PARSE_TYPED_ATTRIBUTE(table, prop, "translations", SkelAnimation, skelanim->translations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "rotations", SkelAnimation, skelanim->rotations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "scales", SkelAnimation, skelanim->scales)
    PARSE_TYPED_ATTRIBUTE(table, prop, "blendShapes", SkelAnimation, skelanim->blendShapes)
    PARSE_TYPED_ATTRIBUTE(table, prop, "blendShapeWeights", SkelAnimation, skelanim->blendShapeWeights)
    ADD_PROPERTY(table, prop, Skeleton, skelanim->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}